

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_remove_incoming_commands
               (ENetList *queue,ENetListIterator startCommand,ENetListIterator endCommand,
               ENetIncomingCommand *excludeCommand)

{
  ENetIncomingCommand *pEVar1;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator currentCommand;
  ENetIncomingCommand *excludeCommand_local;
  ENetListIterator endCommand_local;
  ENetListIterator startCommand_local;
  ENetList *queue_local;
  
  pEVar1 = (ENetIncomingCommand *)startCommand;
  while (incomingCommand = pEVar1, incomingCommand != (ENetIncomingCommand *)endCommand) {
    pEVar1 = (ENetIncomingCommand *)(incomingCommand->incomingCommandList).next;
    if (incomingCommand != excludeCommand) {
      enet_list_remove(&incomingCommand->incomingCommandList);
      if ((incomingCommand->packet != (ENetPacket *)0x0) &&
         (incomingCommand->packet->referenceCount = incomingCommand->packet->referenceCount - 1,
         incomingCommand->packet->referenceCount == 0)) {
        enet_packet_destroy(incomingCommand->packet);
      }
      if (incomingCommand->fragments != (uint32_t *)0x0) {
        enet_free(incomingCommand->fragments);
      }
      enet_free(incomingCommand);
    }
  }
  return;
}

Assistant:

static void enet_peer_remove_incoming_commands(ENetList* queue, ENetListIterator startCommand, ENetListIterator endCommand, ENetIncomingCommand* excludeCommand) {
	ENetListIterator currentCommand;

	for (currentCommand = startCommand; currentCommand != endCommand;) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;
		currentCommand = enet_list_next(currentCommand);

		if (incomingCommand == excludeCommand)
			continue;

		enet_list_remove(&incomingCommand->incomingCommandList);

		if (incomingCommand->packet != NULL) {
			--incomingCommand->packet->referenceCount;

			if (incomingCommand->packet->referenceCount == 0)
				enet_packet_destroy(incomingCommand->packet);
		}

		if (incomingCommand->fragments != NULL)
			enet_free(incomingCommand->fragments);

		enet_free(incomingCommand);
	}
}